

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZNLMultGridAnalysis.cpp
# Opt level: O3

void __thiscall
TPZNonLinMultGridAnalysis::TPZNonLinMultGridAnalysis
          (TPZNonLinMultGridAnalysis *this,TPZCompMesh *cmesh)

{
  TPZStack<TPZCompMesh_*,_10> *this_00;
  TPZSolver *pTVar1;
  TPZMatrixSolver<double> *pTVar2;
  TPZFMatrix<double> *this_01;
  TPZFMatrix<double> *A;
  TPZStepSolver<double> solver;
  TPZAutoPointer<TPZMatrix<double>_> local_138;
  undefined1 local_130 [256];
  
  TPZLinearAnalysis::TPZLinearAnalysis
            (&this->super_TPZLinearAnalysis,&PTR_PTR_0196b290,cmesh,true,(ostream *)&std::cout);
  (this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZNonLinMultGridAnalysis_0196b180;
  this_00 = &this->fMeshes;
  TPZVec<TPZCompMesh_*>::TPZVec((TPZVec<TPZCompMesh_*> *)this_00,0);
  (this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fStore =
       (this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.fExtAlloc;
  (this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fNElements = 0;
  (this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
  (this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01920b48;
  (this->fSolutions).super_TPZManVector<TPZFMatrix<double>_*,_10>.super_TPZVec<TPZFMatrix<double>_*>
  .fStore = (this->fSolutions).super_TPZManVector<TPZFMatrix<double>_*,_10>.fExtAlloc;
  (this->fSolutions).super_TPZManVector<TPZFMatrix<double>_*,_10>.super_TPZVec<TPZFMatrix<double>_*>
  .fNElements = 0;
  (this->fSolutions).super_TPZManVector<TPZFMatrix<double>_*,_10>.super_TPZVec<TPZFMatrix<double>_*>
  .fNAlloc = 0;
  (this->fSolutions).super_TPZManVector<TPZFMatrix<double>_*,_10>.super_TPZVec<TPZFMatrix<double>_*>
  ._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0196b5d0;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fStore =
       (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.fExtAlloc;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNElements = 0;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNAlloc = 0;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01822c80;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fStore =
       (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.fExtAlloc;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNElements = 0;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNAlloc = 0;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01822c80;
  this->fBegin = 0;
  this->fInit = 0;
  local_130._0_8_ = local_130 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_130,"* * * MALHA INICIAL * * *","");
  TPZCompMesh::SetName(cmesh,(string *)local_130);
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  (*(this_00->super_TPZManVector<TPZCompMesh_*,_10>).super_TPZVec<TPZCompMesh_*>._vptr_TPZVec[3])
            (this_00,(this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.
                     super_TPZVec<TPZCompMesh_*>.fNElements + 1);
  (this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fStore
  [(this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fNElements + -1
  ] = cmesh;
  local_138.fRef = (TPZReference *)operator_new(0x10);
  ((local_138.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_138.fRef)->fPointer = (TPZMatrix<double> *)0x0;
  LOCK();
  ((local_138.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZStepSolver<double>::TPZStepSolver((TPZStepSolver<double> *)local_130,&local_138);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_138);
  TPZStepSolver<double>::SetDirect((TPZStepSolver<double> *)local_130,ELDLt);
  pTVar1 = TPZStepSolver<double>::Clone((TPZStepSolver<double> *)local_130);
  pTVar2 = (TPZMatrixSolver<double> *)
           __dynamic_cast(pTVar1,&TPZSolver::typeinfo,&TPZMatrixSolver<double>::typeinfo,0);
  (*(this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable[0x10])
            (this,pTVar2);
  (*(this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
    super_TPZVec<TPZMatrixSolver<double>_*>._vptr_TPZVec[3])
            (&this->fSolvers,
             (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
             super_TPZVec<TPZMatrixSolver<double>_*>.fNElements + 1);
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fStore
  [(this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
   super_TPZVec<TPZMatrixSolver<double>_*>.fNElements + -1] = pTVar2;
  this_01 = (TPZFMatrix<double> *)operator_new(0x90);
  A = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                (&(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution);
  TPZFMatrix<double>::TPZFMatrix(this_01,A);
  (*(this->fSolutions).super_TPZManVector<TPZFMatrix<double>_*,_10>.
    super_TPZVec<TPZFMatrix<double>_*>._vptr_TPZVec[3])
            (&this->fSolutions,
             (this->fSolutions).super_TPZManVector<TPZFMatrix<double>_*,_10>.
             super_TPZVec<TPZFMatrix<double>_*>.fNElements + 1);
  (this->fSolutions).super_TPZManVector<TPZFMatrix<double>_*,_10>.super_TPZVec<TPZFMatrix<double>_*>
  .fStore[(this->fSolutions).super_TPZManVector<TPZFMatrix<double>_*,_10>.
          super_TPZVec<TPZFMatrix<double>_*>.fNElements + -1] = this_01;
  (*(this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
    super_TPZVec<TPZMatrixSolver<double>_*>._vptr_TPZVec[3])
            (&this->fPrecondition,
             (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
             super_TPZVec<TPZMatrixSolver<double>_*>.fNElements + 1);
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fStore
  [(this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
   super_TPZVec<TPZMatrixSolver<double>_*>.fNElements + -1] = (TPZMatrixSolver<double> *)0x0;
  TPZStepSolver<double>::~TPZStepSolver((TPZStepSolver<double> *)local_130);
  return;
}

Assistant:

TPZNonLinMultGridAnalysis::TPZNonLinMultGridAnalysis(TPZCompMesh *cmesh) : 
TPZLinearAnalysis(cmesh), fBegin(0), fInit(0) {
	cmesh->SetName("* * * MALHA INICIAL * * *");
	fMeshes.Push(cmesh);
	TPZStepSolver<STATE> solver;
	solver.SetDirect(ELDLt);
	TPZMatrixSolver<STATE> *clone = dynamic_cast<TPZMatrixSolver<STATE> *>(solver.Clone());
	SetSolver(*clone);
	fSolvers.Push(clone);
	fSolutions.Push(new TPZFMatrix<STATE>(fSolution));
	fPrecondition.Push(0);
}